

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

int writeasctable(fitsfile *fptr,int *status)

{
  int iVar1;
  fitsfile *in_RSI;
  char *tunit [2];
  char *tform [2];
  char *ttype [2];
  char extname [11];
  double elapse;
  float cpufrac;
  float elapcpu;
  float size;
  float rate;
  long nrows;
  long firstelem;
  long firstrow;
  long ntodo;
  long nremain;
  int tfields;
  long *in_stack_000071c0;
  LONGLONG in_stack_000071c8;
  LONGLONG in_stack_000071d0;
  LONGLONG in_stack_000071d8;
  int in_stack_000071e4;
  fitsfile *in_stack_000071e8;
  int *in_stack_00007230;
  int *status_00;
  fitsfile *fptr_00;
  long *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  fitsfile *pfVar2;
  int local_63 [2];
  undefined2 local_5b;
  undefined1 local_59;
  double local_58;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  fitsfile *in_stack_ffffffffffffffc0;
  fitsfile *pfVar3;
  fitsfile *local_20;
  
  local_63 = (int  [2])0x65545f6465657053;
  local_5b = 0x7473;
  local_59 = 0;
  status_00 = local_63;
  fptr_00 = in_RSI;
  iVar1 = ffcrtb((fitsfile *)"second",0,(LONGLONG)"I6",0,(char **)0x270be5,(char **)0x270be5,
                 (char **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 &in_stack_ffffffffffffffc0->HDUposition);
  if (iVar1 != 0) {
    printerror((int)in_stack_ffffffffffffffb4);
  }
  ffgrsz(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,&fptr_00->HDUposition);
  if (19999 < (long)in_stack_ffffffffffffffc0) {
    in_stack_ffffffffffffffc0 = (fitsfile *)0x4e20;
  }
  local_20 = (fitsfile *)0x61a80;
  pfVar3 = in_stack_ffffffffffffffc0;
  printf("Write %7drow x %dcol asctable %4ld rows/loop:",400000,2,in_stack_ffffffffffffffc0);
  marktime((int *)in_stack_ffffffffffffff50);
  for (; local_20 != (fitsfile *)0x0; local_20 = (fitsfile *)((long)local_20 - (long)pfVar2)) {
    pfVar2 = local_20;
    if ((long)pfVar3 < (long)local_20) {
      pfVar2 = pfVar3;
    }
    in_stack_ffffffffffffff58 = pfVar2;
    ffpclj(in_stack_000071e8,in_stack_000071e4,in_stack_000071d8,in_stack_000071d0,in_stack_000071c8
           ,in_stack_000071c0,in_stack_00007230);
    ffpclj(in_stack_000071e8,in_stack_000071e4,in_stack_000071d8,in_stack_000071d0,in_stack_000071c8
           ,in_stack_000071c0,in_stack_00007230);
  }
  ffflus(fptr_00,status_00);
  gettime((double *)in_stack_ffffffffffffffc0,(float *)in_stack_ffffffffffffff58,
          (int *)in_stack_ffffffffffffff50);
  printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4014ccccc0000000,local_58,
         (double)(float)(((double)in_stack_ffffffffffffffb4 / local_58) * 100.0),
         (double)(float)(5.199999809265137 / local_58));
  return in_RSI->HDUposition;
}

Assistant:

int writeasctable (fitsfile *fptr, int *status)

    /*********************************************************/
    /* Create an ASCII table extension containing 2 columns  */
    /*********************************************************/
{
    int tfields = 2;
    long nremain, ntodo, firstrow = 1, firstelem = 1;
    long nrows;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    char extname[] = "Speed_Test";           /* extension name */

    /* define the name, datatype, and physical units for the columns */
    char *ttype[] = { "first", "second" };
    char *tform[] = {"I6",       "I6"   };
    char *tunit[] = { " ",      " "     };

    /* append a new empty ASCII table onto the FITS file */
    if ( fits_create_tbl( fptr, ASCII_TBL, AROWS, tfields, ttype, tform,
                tunit, extname, status) )
         printerror( *status );

    /* get table row size and optimum number of rows to write per loop */
    fits_get_rowsize(fptr, &nrows, status);
    nrows = minvalue(nrows, SHTSIZE);
    nremain = AROWS;

    printf("Write %7drow x %dcol asctable %4ld rows/loop:", AROWS, tfields,
           nrows);
    marktime(status);

    while(nremain)
    {
      ntodo = minvalue(nrows, nremain);
      ffpclj(fptr, 1, firstrow, firstelem, ntodo, sarray, status);
      ffpclj(fptr, 2, firstrow, firstelem, ntodo, sarray, status);
      firstrow += ntodo;
      nremain -= ntodo;
    }

    ffflus(fptr, status);  /* flush all buffers to disk */

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = AROWS * 13. / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}